

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiWindowSettings * ImGui::FindWindowSettings(ImGuiID id)

{
  uint uVar1;
  ImGuiWindowSettings *pIVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = (GImGui->SettingsWindows).Size;
  if ((ulong)uVar1 != 0) {
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    lVar4 = 0;
    do {
      if (uVar3 * 0x18 == lVar4) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                      ,0x4e6,
                      "T &ImVector<ImGuiWindowSettings>::operator[](int) [T = ImGuiWindowSettings]")
        ;
      }
      pIVar2 = (GImGui->SettingsWindows).Data;
      if (*(ImGuiID *)((long)&pIVar2->ID + lVar4) == id) {
        return (ImGuiWindowSettings *)((long)&pIVar2->Name + lVar4);
      }
      lVar4 = lVar4 + 0x18;
    } while ((ulong)uVar1 * 0x18 != lVar4);
  }
  return (ImGuiWindowSettings *)0x0;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettings(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (int i = 0; i != g.SettingsWindows.Size; i++)
        if (g.SettingsWindows[i].ID == id)
            return &g.SettingsWindows[i];
    return NULL;
}